

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O1

void intgemm::kernel_write_test<(intgemm::CPUType)4,signed_char>(void)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  AlignedVector<signed_char> input;
  AlignedVector<signed_char> output;
  AssertionHandler catchAssertionHandler;
  char local_e9;
  AlignedVector<signed_char> local_e8;
  AlignedVector<signed_char> local_d8;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  char *local_a8;
  char *local_a0;
  size_t sStack_98;
  char *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  if (3 < kCPU) {
    AlignedVector<signed_char>::AlignedVector(&local_e8,0x40,0x40);
    AlignedVector<signed_char>::AlignedVector(&local_d8,0x40,0x40);
    if (local_e8.size_ != 0) {
      auVar12 = vpbroadcastq_avx512f();
      auVar13 = vmovdqa64_avx512f(_DAT_001bc500);
      uVar10 = 0;
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar22 = vpbroadcastb_avx512bw(ZEXT116(0x40));
      do {
        auVar23 = vpbroadcastq_avx512f();
        auVar24 = vporq_avx512f(auVar23,auVar14);
        auVar25 = vporq_avx512f(auVar23,auVar15);
        auVar26 = vporq_avx512f(auVar23,auVar16);
        auVar27 = vporq_avx512f(auVar23,auVar17);
        auVar28 = vporq_avx512f(auVar23,auVar18);
        auVar29 = vporq_avx512f(auVar23,auVar19);
        auVar30 = vporq_avx512f(auVar23,auVar20);
        auVar23 = vporq_avx512f(auVar23,auVar21);
        vpcmpuq_avx512f(auVar23,auVar12,2);
        vpcmpuq_avx512f(auVar30,auVar12,2);
        vpcmpuq_avx512f(auVar29,auVar12,2);
        vpcmpuq_avx512f(auVar28,auVar12,2);
        vpcmpuq_avx512f(auVar27,auVar12,2);
        vpcmpuq_avx512f(auVar26,auVar12,2);
        vpcmpuq_avx512f(auVar25,auVar12,2);
        vpcmpuq_avx512f(auVar24,auVar12,2);
        auVar23 = vmovdqu8_avx512bw(auVar13);
        *(undefined1 (*) [64])(local_e8.mem_ + uVar10) = auVar23;
        uVar10 = uVar10 + 0x40;
        auVar13 = vpaddb_avx512bw(auVar13,auVar22);
      } while ((local_e8.size_ + 0x3f & 0xffffffffffffffc0) != uVar10);
    }
    uVar2 = *(undefined8 *)(local_e8.mem_ + 8);
    uVar3 = *(undefined8 *)(local_e8.mem_ + 0x10);
    uVar4 = *(undefined8 *)(local_e8.mem_ + 0x18);
    uVar5 = *(undefined8 *)(local_e8.mem_ + 0x20);
    uVar6 = *(undefined8 *)(local_e8.mem_ + 0x28);
    uVar7 = *(undefined8 *)(local_e8.mem_ + 0x30);
    uVar8 = *(undefined8 *)(local_e8.mem_ + 0x38);
    *(undefined8 *)local_d8.mem_ = *(undefined8 *)local_e8.mem_;
    *(undefined8 *)(local_d8.mem_ + 8) = uVar2;
    *(undefined8 *)(local_d8.mem_ + 0x10) = uVar3;
    *(undefined8 *)(local_d8.mem_ + 0x18) = uVar4;
    *(undefined8 *)(local_d8.mem_ + 0x20) = uVar5;
    *(undefined8 *)(local_d8.mem_ + 0x28) = uVar6;
    *(undefined8 *)(local_d8.mem_ + 0x30) = uVar7;
    *(undefined8 *)(local_d8.mem_ + 0x38) = uVar8;
    lVar11 = 0;
    do {
      local_b8._vptr_ITransientExpression = (_func_int **)0x1b3b11;
      local_b8.m_isBinaryExpression = true;
      local_b8.m_result = false;
      local_b8._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
      ;
      local_c8.line = 0x1c;
      Catch::StringRef::StringRef(&local_88,"output[i] == ElemType_(i)");
      Catch::AssertionHandler::AssertionHandler
                (&local_78,(StringRef *)&local_b8,&local_c8,local_88,ContinueOnFailure);
      pcVar9 = local_d8.mem_;
      cVar1 = local_d8.mem_[lVar11];
      local_e9 = (char)lVar11;
      Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
      local_b8.m_result = (char)lVar11 == cVar1;
      local_b8.m_isBinaryExpression = true;
      local_a8 = pcVar9 + lVar11;
      local_b8._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_001ed9d8;
      local_a0 = local_c8.file;
      sStack_98 = local_c8.line;
      local_90 = &local_e9;
      Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
      Catch::ITransientExpression::~ITransientExpression(&local_b8);
      Catch::AssertionHandler::complete(&local_78);
      if (local_78.m_completed == false) {
        (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])(local_78.m_resultCapture,&local_78)
        ;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x40);
    free(local_d8.mem_);
    free(local_e8.mem_);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}